

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

Instr * __thiscall IR::Instr::Copy(Instr *this,bool copyDst)

{
  undefined1 *puVar1;
  OpCode opcode;
  Func *pFVar2;
  code *pcVar3;
  bool bVar4;
  byte bVar5;
  BailOutKind BVar6;
  uint32 uVar7;
  BailOutInfo *bailOutInfo;
  BailOutInstrTemplate<IR::Instr> *this_00;
  Opnd *pOVar8;
  undefined4 *puVar9;
  
  if ((this->field_0x38 & 0x50) == 0) {
    switch(this->m_kind) {
    case InstrKindInstr:
      this_00 = (BailOutInstrTemplate<IR::Instr> *)New(this->m_opcode,this->m_func);
      break;
    default:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0x1ef,"((0))","Copy of other instr kinds NYI");
      if (!bVar4) goto LAB_004b9d07;
      *puVar9 = 0;
      this_00 = (BailOutInstrTemplate<IR::Instr> *)0x0;
      break;
    case InstrKindProfiled:
      this_00 = (BailOutInstrTemplate<IR::Instr> *)
                ProfiledInstr::CopyProfiledInstr((ProfiledInstr *)this);
      break;
    case InstrKindPragma:
      this_00 = (BailOutInstrTemplate<IR::Instr> *)PragmaInstr::New(this->m_opcode,0,this->m_func);
      break;
    case InstrKindJitProfiling:
      this_00 = (BailOutInstrTemplate<IR::Instr> *)
                JitProfilingInstr::CopyJitProfiling((JitProfilingInstr *)this);
    }
  }
  else {
    opcode = this->m_opcode;
    BVar6 = GetBailOutKind(this);
    bailOutInfo = GetBailOutInfo(this);
    this_00 = BailOutInstrTemplate<IR::Instr>::New(opcode,BVar6,bailOutInfo,this->m_func);
    uVar7 = GetByteCodeOffset(this);
    SetByteCodeOffset(&this_00->super_Instr,uVar7);
    if ((this->field_0x38 & 0x40) != 0) {
      puVar1 = &(this_00->super_Instr).field_0x38;
      *puVar1 = *puVar1 | 0x40;
      BVar6 = GetAuxBailOutKind(this);
      SetAuxBailOutKind(&this_00->super_Instr,BVar6);
    }
  }
  if (copyDst && this->m_dst != (Opnd *)0x0) {
    pOVar8 = Opnd::Copy(this->m_dst,this->m_func);
    SetDst(&this_00->super_Instr,pOVar8);
  }
  if (this->m_src1 != (Opnd *)0x0) {
    pOVar8 = Opnd::Copy(this->m_src1,this->m_func);
    if ((this_00->super_Instr).m_src1 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
      if (!bVar4) goto LAB_004b9d07;
      *puVar9 = 0;
    }
    pFVar2 = (this_00->super_Instr).m_func;
    if (pOVar8->isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar4) goto LAB_004b9d07;
      *puVar9 = 0;
    }
    bVar5 = pOVar8->field_0xb;
    if ((bVar5 & 2) != 0) {
      pOVar8 = Opnd::Copy(pOVar8,pFVar2);
      bVar5 = pOVar8->field_0xb;
    }
    pOVar8->field_0xb = bVar5 | 2;
    (this_00->super_Instr).m_src1 = pOVar8;
    if (this->m_src2 == (Opnd *)0x0) goto LAB_004b9c41;
    pOVar8 = Opnd::Copy(this->m_src2,this->m_func);
    if ((this_00->super_Instr).m_src2 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
      if (!bVar4) goto LAB_004b9d07;
      *puVar9 = 0;
    }
    pFVar2 = (this_00->super_Instr).m_func;
    if (pOVar8->isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar4) {
LAB_004b9d07:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar9 = 0;
    }
    bVar5 = pOVar8->field_0xb;
    if ((bVar5 & 2) != 0) {
      pOVar8 = Opnd::Copy(pOVar8,pFVar2);
      bVar5 = pOVar8->field_0xb;
    }
    pOVar8->field_0xb = bVar5 | 2;
    (this_00->super_Instr).m_src2 = pOVar8;
  }
LAB_004b9c41:
  *(ushort *)&(this_00->super_Instr).field_0x36 =
       *(ushort *)&(this_00->super_Instr).field_0x36 & 0xffdf | *(ushort *)&this->field_0x36 & 0x20;
  pFVar2 = this->m_func->topFunc;
  if ((pFVar2->hasInstrNumber == false) && (pFVar2->maintainByteCodeOffset == true)) {
    uVar7 = GetByteCodeOffset(this);
    SetByteCodeOffset(&this_00->super_Instr,uVar7);
  }
  *(ushort *)&(this_00->super_Instr).field_0x36 =
       *(ushort *)&(this_00->super_Instr).field_0x36 & 0xffef | *(ushort *)&this->field_0x36 & 0x10;
  return &this_00->super_Instr;
}

Assistant:

Instr *
Instr::Copy(bool copyDst)
{
    Instr * instrCopy;

    if (this->HasBailOutInfo() || this->HasAuxBailOut())
    {
        instrCopy = BailOutInstr::New(this->m_opcode, this->GetBailOutKind(), this->GetBailOutInfo(), this->m_func);
        instrCopy->SetByteCodeOffset(this->GetByteCodeOffset());
        if (this->HasAuxBailOut())
        {
            instrCopy->hasAuxBailOut = true;
            instrCopy->SetAuxBailOutKind(this->GetAuxBailOutKind());
        }
    }
    else
    {
        switch (this->GetKind())
        {
        case InstrKindInstr:
            instrCopy = Instr::New(this->m_opcode, this->m_func);
            break;

        case InstrKindProfiled:
            instrCopy = this->AsProfiledInstr()->CopyProfiledInstr();
            break;

        case InstrKindJitProfiling:
            instrCopy = this->AsJitProfilingInstr()->CopyJitProfiling();
            break;

        case InstrKindPragma:
            instrCopy = this->AsPragmaInstr()->CopyPragma();
            break;

        default:
            instrCopy = nullptr;
            AnalysisAssertMsg(UNREACHED, "Copy of other instr kinds NYI");
        }
    }

    Opnd * opnd = this->GetDst();
    if (copyDst && opnd)
    {
        instrCopy->SetDst(opnd->Copy(this->m_func));
    }
    opnd = this->GetSrc1();
    if (opnd)
    {
        instrCopy->SetSrc1(opnd->Copy(this->m_func));
        opnd = this->GetSrc2();
        if (opnd)
        {
            instrCopy->SetSrc2(opnd->Copy(this->m_func));
        }
    }

    instrCopy->isInlineeEntryInstr = this->isInlineeEntryInstr;

    if (this->m_func->DoMaintainByteCodeOffset())
    {
        instrCopy->SetByteCodeOffset(this->GetByteCodeOffset());
    }
    instrCopy->usesStackArgumentsObject = this->usesStackArgumentsObject;
    return instrCopy;
}